

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  string *value;
  Edition value_00;
  pointer __s1;
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  SourceCodeInfo *pSVar5;
  undefined8 uVar6;
  ulong uVar7;
  Arena *pAVar8;
  byte bVar9;
  LocationRecorder *unaff_RBP;
  size_type __rlen;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LogMessage aLStack_a8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  LocationRecorder local_90;
  SourceCodeInfo local_78;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_78,(Arena *)0x0);
  this->source_code_info_ = &local_78;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_90,this);
  LocationRecorder::RecordLegacyLocation(&local_90,&file->super_Message,OTHER);
  value = &this->syntax_identifier_;
  if (this->require_syntax_identifier_ == false) {
    __s1 = (this->input_->current_).text._M_dataplus._M_p;
    sVar1 = (this->input_->current_).text._M_string_length;
    if (sVar1 == 7) {
      iVar4 = bcmp(__s1,"edition",7);
      if (iVar4 != 0) goto LAB_001ca00b;
      goto LAB_001c9f45;
    }
    if ((sVar1 == 6) && (iVar4 = bcmp(__s1,"syntax",6), iVar4 == 0)) goto LAB_001c9f45;
LAB_001ca00b:
    if (this->stop_after_syntax_identifier_ == false) {
      absl::lts_20240722::log_internal::LogMessage::LogMessage
                (aLStack_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
                 ,0x2ae);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (aLStack_a8,0x28,"No syntax specified for the proto file: ");
      uVar6 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        (aLStack_a8,
                         (string *)
                         ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        );
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (uVar6,0x22,". Please use \'syntax = \"proto2\";\' ");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (uVar6,0x2c,"or \'syntax = \"proto3\";\' to specify a syntax ");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (uVar6,0x26,"version. (Defaulted to proto2 syntax.)");
      absl::lts_20240722::log_internal::LogMessage::~LogMessage(aLStack_a8);
      std::__cxx11::string::operator=((string *)value,"proto2");
    }
LAB_001ca015:
    if (this->stop_after_syntax_identifier_ == false) {
      bVar2 = true;
      if ((this->input_->current_).type != TYPE_END) {
        local_98 = &this->upcoming_detached_comments_;
        unaff_RBP = &local_90;
        do {
          bVar3 = ParseTopLevelStatement(this,file,unaff_RBP);
          if (!bVar3) {
            SkipStatement(this);
            if (((this->input_->current_).text._M_string_length == 1) &&
               (iVar4 = bcmp((this->input_->current_).text._M_dataplus._M_p,"}",1), iVar4 == 0)) {
              RecordError(this,(ErrorMaker)ZEXT816(0x3431aa));
              io::Tokenizer::NextWithComments
                        (this->input_,(string *)0x0,local_98,&this->upcoming_doc_comments_);
            }
          }
        } while ((this->input_->current_).type != TYPE_END);
      }
      bVar9 = (byte)unaff_RBP;
      goto LAB_001ca0b5;
    }
    bVar9 = this->had_errors_ ^ 1;
  }
  else {
LAB_001c9f45:
    bVar2 = ParseSyntaxIdentifier(this,file,&local_90);
    if (bVar2) {
      if (file != (FileDescriptorProto *)0x0) {
        *(byte *)&file->field_0 = *(byte *)&file->field_0 | 4;
        pAVar8 = (Arena *)(file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>(&(file->field_0)._impl_.syntax_,value,pAVar8);
        iVar4 = std::__cxx11::string::compare((char *)value);
        if (iVar4 == 0) {
          value_00 = this->edition_;
          unaff_RBP = (LocationRecorder *)(ulong)value_00;
          bVar2 = Edition_IsValid(value_00);
          if (!bVar2) {
            __assert_fail("::google::protobuf::Edition_IsValid(value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
                          ,0x3253,
                          "void google::protobuf::FileDescriptorProto::_internal_set_edition(::google::protobuf::Edition)"
                         );
          }
          (file->field_0)._impl_.edition_ = value_00;
          *(byte *)&file->field_0 = *(byte *)&file->field_0 | 0x20;
        }
      }
      goto LAB_001ca015;
    }
    bVar9 = 0;
  }
  bVar2 = false;
LAB_001ca0b5:
  LocationRecorder::~LocationRecorder(&local_90);
  if (bVar2) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    if (file == (FileDescriptorProto *)0x0) {
      __assert_fail("file != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
                    ,0x2ca,
                    "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                   );
    }
    *(byte *)&file->field_0 = *(byte *)&file->field_0 | 0x10;
    if ((file->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0) {
      pAVar8 = (Arena *)(file->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      pSVar5 = (SourceCodeInfo *)Arena::DefaultConstruct<google::protobuf::SourceCodeInfo>(pAVar8);
      (file->field_0)._impl_.source_code_info_ = pSVar5;
    }
    pSVar5 = (file->field_0)._impl_.source_code_info_;
    if (pSVar5 != &local_78) {
      if ((local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ =
             *(ulong *)(local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                       0xfffffffffffffffe);
      }
      uVar7 = (pSVar5->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar7 & 1) != 0) {
        uVar7 = *(ulong *)(uVar7 & 0xfffffffffffffffe);
      }
      if (local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ == uVar7) {
        SourceCodeInfo::InternalSwap(&local_78,pSVar5);
      }
      else {
        internal::GenericSwap(&local_78.super_Message,&pSVar5->super_Message);
      }
    }
    bVar9 = this->had_errors_ ^ 1;
  }
  SourceCodeInfo::~SourceCodeInfo(&local_78);
  return (bool)(bVar9 & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax") ||
        LookingAt("edition")) {
      if (!ParseSyntaxIdentifier(file, root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != nullptr) {
        file->set_syntax(syntax_identifier_);
        if (syntax_identifier_ == "editions") {
          file->set_edition(edition_);
        }
      }
    } else if (!stop_after_syntax_identifier_) {
      ABSL_LOG(WARNING) << "No syntax specified for the proto file: "
                        << file->name()
                        << ". Please use 'syntax = \"proto2\";' "
                        << "or 'syntax = \"proto3\";' to specify a syntax "
                        << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          RecordError("Unmatched \"}\".");
          input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = nullptr;
  source_code_info_ = nullptr;
  assert(file != nullptr);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}